

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtipccommon.cpp
# Opt level: O3

QNativeIpcKey * __thiscall
QtIpcCommon::legacyPlatformSafeKey
          (QNativeIpcKey *__return_storage_ptr__,QtIpcCommon *this,QString *key,IpcType ipcType,
          Type type)

{
  QChar ch;
  long lVar1;
  long lVar2;
  Data *pDVar3;
  Data *data;
  char16_t *pcVar4;
  char *pcVar5;
  QString *__range1;
  long lVar6;
  qsizetype qVar7;
  undefined2 in_register_00000082;
  Algorithm method;
  long in_FS_OFFSET;
  QLatin1StringView str;
  QLatin1StringView str_00;
  QByteArrayView data_00;
  QString local_e8;
  QString local_c8;
  QString local_a8;
  QByteArray local_88;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString_&> local_68;
  long local_38;
  
  method = CONCAT22(in_register_00000082,type);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->key).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->key).d.size = 0;
  __return_storage_ptr__->d = (QNativeIpcKeyPrivate *)0x0;
  (__return_storage_ptr__->key).d.d = (Data *)0x0;
  (__return_storage_ptr__->typeAndFlags).type = (Type)ipcType;
  (__return_storage_ptr__->typeAndFlags).reserved1 = 0;
  (__return_storage_ptr__->typeAndFlags).reserved2 = 0;
  if (*(long *)(this + 0x10) == 0) goto LAB_0021d5e5;
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QString::toUtf8_helper((QByteArray *)&local_a8,(QString *)this);
  data_00.m_data = (storage_type *)0x2;
  data_00.m_size = (qsizetype)local_a8.d.ptr;
  QCryptographicHash::hash
            ((QByteArray *)&local_68,(QCryptographicHash *)local_a8.d.size,data_00,method);
  QByteArray::toHex(&local_88,(QByteArray *)&local_68,'\0');
  if (&(local_68.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.a.a.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
    }
  }
  local_a8.d.d = (Data *)0x0;
  local_a8.d.ptr = (char16_t *)0x0;
  local_a8.d.size = 0;
  QString::reallocData(&local_a8,*(long *)(this + 0x10) + 0x3b,KeepSize);
  if ((&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) &&
     (*(qsizetype *)((long)local_a8.d.d + 8) != 0)) {
    *(byte *)&(((ArrayOptions *)((long)local_a8.d.d + 4))->
              super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(((ArrayOptions *)((long)local_a8.d.d + 4))->
               super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  if ((int)key == 0) {
    pcVar5 = "qipc_sharedmemory_";
    qVar7 = 0x12;
LAB_0021d40a:
    str.m_data = pcVar5;
    str.m_size = qVar7;
    QString::append(&local_a8,str);
  }
  else if ((int)key == 1) {
    pcVar5 = "qipc_systemsem_";
    qVar7 = 0xf;
    goto LAB_0021d40a;
  }
  lVar1 = *(long *)(this + 0x10);
  if (lVar1 != 0) {
    lVar2 = *(long *)(this + 8);
    lVar6 = 0;
    do {
      ch.ucs = *(char16_t *)(lVar2 + lVar6);
      if ((ushort)ch.ucs < 0x61) {
        if ((ushort)(ch.ucs + L'﾿') < 0x1a) goto LAB_0021d44c;
      }
      else if ((ushort)ch.ucs < 0x7b) {
LAB_0021d44c:
        QString::append(&local_a8,ch);
      }
      lVar6 = lVar6 + 2;
    } while (lVar1 * 2 != lVar6);
  }
  str_00.m_data = local_88.d.ptr;
  str_00.m_size = local_88.d.size;
  QString::append(&local_a8,str_00);
  if ((ipcType & 0xffff) != 0x101) {
    if ((ipcType & 0xffff) == 0x100) {
      QString::insert(&local_a8,0,(QChar)0x2f);
    }
    else {
      QStandardPaths::writableLocation(&local_e8,TempLocation);
      local_68.a.a.d.size = local_e8.d.size;
      local_68.a.a.d.ptr = local_e8.d.ptr;
      local_68.a.a.d.d = local_e8.d.d;
      local_e8.d.size = 0;
      local_e8.d.d = (Data *)0x0;
      local_e8.d.ptr = (char16_t *)0x0;
      local_68.a.b = L'/';
      local_68.b = &local_a8;
      QStringBuilder<QStringBuilder<QString,_char16_t>,_QString_&>::convertTo<QString>
                (&local_c8,&local_68);
      pcVar4 = local_a8.d.ptr;
      data = local_a8.d.d;
      qVar7 = local_c8.d.size;
      pDVar3 = local_c8.d.d;
      local_c8.d.d = local_a8.d.d;
      local_a8.d.d = pDVar3;
      local_a8.d.ptr = local_c8.d.ptr;
      local_c8.d.ptr = pcVar4;
      local_c8.d.size = local_a8.d.size;
      local_a8.d.size = qVar7;
      if (&data->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&data->super_QArrayData,2,0x10);
        }
      }
      if (&(local_68.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
        ;
        UNLOCK();
        if (((local_68.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          QArrayData::deallocate(&(local_68.a.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    QNativeIpcKey::setNativeKey(__return_storage_ptr__,&local_a8);
    QNativeIpcKeyPrivate::setLegacyKey(__return_storage_ptr__,(QString *)this);
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
    }
  }
LAB_0021d5e5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QNativeIpcKey QtIpcCommon::legacyPlatformSafeKey(const QString &key, QtIpcCommon::IpcType ipcType,
                                                 QNativeIpcKey::Type type)
{
    QNativeIpcKey k(type);
    if (key.isEmpty())
        return k;

    QByteArray hex = QCryptographicHash::hash(key.toUtf8(), QCryptographicHash::Sha1).toHex();

    if (type == QNativeIpcKey::Type::PosixRealtime) {
#if defined(Q_OS_DARWIN)
        if (qt_apple_isSandboxed()) {
            // Sandboxed applications on Apple platforms require the shared memory name
            // to be in the form <application group identifier>/<custom identifier>.
            // Since we don't know which application group identifier the user wants
            // to apply, we instead document that requirement, and use the key directly.
            QNativeIpcKeyPrivate::setNativeAndLegacyKeys(k, key, key);
        } else {
            // The shared memory name limit on Apple platforms is very low (30 characters),
            // so we can't use the logic below of combining the prefix, key, and a hash,
            // to ensure a unique and valid name. Instead we use the first part of the
            // hash, which should still long enough to avoid collisions in practice.
            QString native = u'/' + QLatin1StringView(hex).left(SHM_NAME_MAX - 1);
            QNativeIpcKeyPrivate::setNativeAndLegacyKeys(k, native, key);
        }
        return k;
#endif
    }

    QString result;
    result.reserve(1 + 18 + key.size() + 40);
    switch (ipcType) {
    case IpcType::SharedMemory:
        result += "qipc_sharedmemory_"_L1;
        break;
    case IpcType::SystemSemaphore:
        result += "qipc_systemsem_"_L1;
        break;
    }

    for (QChar ch : key) {
        if ((ch >= u'a' && ch <= u'z') ||
           (ch >= u'A' && ch <= u'Z'))
           result += ch;
    }
    result.append(QLatin1StringView(hex));

    switch (type) {
    case QNativeIpcKey::Type::Windows:
        if (isIpcSupported(ipcType, QNativeIpcKey::Type::Windows))
            QNativeIpcKeyPrivate::setNativeAndLegacyKeys(k, result, key);
        return k;
    case QNativeIpcKey::Type::PosixRealtime:
        result.prepend(u'/');
        if (isIpcSupported(ipcType, QNativeIpcKey::Type::PosixRealtime))
            QNativeIpcKeyPrivate::setNativeAndLegacyKeys(k, result, key);
        return k;
    case QNativeIpcKey::Type::SystemV:
        break;
    }
    if (isIpcSupported(ipcType, QNativeIpcKey::Type::SystemV)) {
        result = QStandardPaths::writableLocation(QStandardPaths::TempLocation) + u'/' + result;
        QNativeIpcKeyPrivate::setNativeAndLegacyKeys(k, result, key);
    }
    return k;
}